

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

void fill_derived_format_values(FMContext fmc,FMFormat_conflict format)

{
  FMFieldList field_list;
  int iVar1;
  FMdata_type FVar2;
  char *str;
  FMTypeDesc *pFVar3;
  FMFormat_conflict p_Var4;
  uint uVar5;
  int *piVar6;
  FMFormat_conflict *pp_Var7;
  long lVar8;
  long local_38;
  
  format->context = fmc;
  format->variant = 0;
  format->recursive = 0;
  field_list = format->field_list;
  piVar6 = &field_list->field_size;
  for (lVar8 = 0; lVar8 < format->field_count; lVar8 = lVar8 + 1) {
    iVar1 = is_var_array_field(field_list,(int)lVar8);
    if (iVar1 == 0) {
      FVar2 = FMarray_str_to_data_type(*(char **)(piVar6 + -2),&local_38);
      if ((FVar2 != unknown_type) && (0x10 < *piVar6)) {
        fprintf(_stderr,
                "Field size for field %s in format %s is large, check to see if it is valid.\n",
                ((_FMField *)(piVar6 + -4))->field_name);
      }
    }
    piVar6 = piVar6 + 6;
  }
  generate_var_list(format,format->subformats);
  lVar8 = 0;
  do {
    if (format->field_count <= lVar8) {
      return;
    }
    if (format->var_list[lVar8].string == 1) {
      format->variant = 1;
    }
    else {
      str = base_data_type(field_list[lVar8].field_type);
      FVar2 = FMstr_to_data_type(str);
      if (FVar2 == unknown_type) {
        for (pp_Var7 = format->subformats;
            (pp_Var7 != (FMFormat_conflict *)0x0 &&
            (p_Var4 = *pp_Var7, p_Var4 != (FMFormat_conflict)0x0)); pp_Var7 = pp_Var7 + 1) {
          iVar1 = strcmp(str,p_Var4->format_name);
          if (iVar1 == 0) {
            format->field_subformats[lVar8] = p_Var4;
          }
        }
        p_Var4 = format->field_subformats[lVar8];
      }
      else {
        p_Var4 = (FMFormat_conflict)0x0;
      }
      uVar5 = 1;
      if (format->var_list[lVar8].var_array == 1) {
LAB_0011c015:
        format->variant = uVar5;
      }
      else if (p_Var4 != (FMFormat_conflict)0x0) {
        uVar5 = format->variant | p_Var4->variant;
        goto LAB_0011c015;
      }
      for (pFVar3 = &format->var_list[lVar8].type_desc; pFVar3 != (FMTypeDesc *)0x0;
          pFVar3 = pFVar3->next) {
        if (pFVar3->type == FMType_pointer) {
          format->variant = 1;
        }
      }
      free(str);
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static void
fill_derived_format_values(FMContext fmc, FMFormat format)
{
    FMFieldList field_list;
    int field;
    format->context = fmc;
    format->variant = 0;
    format->recursive = 0;
    field_list = format->field_list;
    for (field = 0; field < format->field_count; field++) {
	int field_size = 0;
	if (is_var_array_field(field_list, field) == 1) {
	    /* variant array, real_field_size is format->pointer_size */
	    field_size = format->pointer_size;
	} else {
	    long elements = 1;
	    FMdata_type base_type;
	    base_type = FMarray_str_to_data_type(field_list[field].field_type,
					       &elements);
	    if ((base_type != unknown_type) &&
		(field_list[field].field_size > 16)) {
		fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			field_list[field].field_name, format->format_name);
	    }
	    field_size = field_list[field].field_size * elements;
	}
	(void) field_size;
    }
    generate_var_list(format, format->subformats);
    for (field = 0; field < format->field_count; field++) {
	if (format->var_list[field].string == 1) {
	    format->variant = 1;
	} else {
	    char *base_type =
		base_data_type(field_list[field].field_type);
	    FMFormat subformat = NULL;
	    FMTypeDesc* desc = NULL;

	    /* if field is of another record format, fill that in */
	    if (FMstr_to_data_type(base_type) == unknown_type) {
	        FMFormat *subformats = format->subformats;
		while (subformats && subformats[0]) {
		    if (strcmp(base_type, subformats[0]->format_name) == 0) {
		    
		        format->field_subformats[field] = subformats[0];
		    }
		    subformats++;
		}
		subformat = format->field_subformats[field];
	    }
	    if (format->var_list[field].var_array == 1) {
		/* got a variant array */
		format->variant = 1;
	    } else {
		/* if field is variant by its subformat being variant */
		if (subformat != NULL) {
		    format->variant |= subformat->variant;
		}
	    }
	    desc = &format->var_list[field].type_desc;
	    while (desc != NULL) {
		if (desc->type == FMType_pointer) format->variant = 1;
		desc = desc->next;
	    }
	    free(base_type);
	}
    }
}